

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

QTextLine currentTextLine(QTextCursor *cursor)

{
  long lVar1;
  char cVar2;
  long lVar3;
  long in_FS_OFFSET;
  QTextLine QVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::block();
  cVar2 = QTextBlock::isValid();
  if (cVar2 != '\0') {
    lVar3 = QTextBlock::layout();
    if (lVar3 != 0) {
      QTextCursor::position();
      QTextBlock::position();
      QVar4 = (QTextLine)QTextLayout::lineForTextPosition((int)lVar3);
      goto LAB_004bcd4b;
    }
  }
  QVar4 = (QTextLine)ZEXT816(0);
LAB_004bcd4b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

static QTextLine currentTextLine(const QTextCursor &cursor)
{
    const QTextBlock block = cursor.block();
    if (!block.isValid())
        return QTextLine();

    const QTextLayout *layout = block.layout();
    if (!layout)
        return QTextLine();

    const int relativePos = cursor.position() - block.position();
    return layout->lineForTextPosition(relativePos);
}